

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O2

bool __thiscall lzham::lzcompressor::put_bytes(lzcompressor *this,void *pBuf,uint buf_len)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  uint n;
  uint num_src_bytes_remaining;
  uint8 *pSrcBuf;
  
  if (this->m_finished != false) {
    return false;
  }
  if (pBuf != (void *)0x0) {
    bVar2 = true;
    while( true ) {
      if (buf_len == 0) {
        return bVar2;
      }
      uVar1 = (this->m_params).m_block_size;
      n = uVar1 - (this->m_block_buf).m_size;
      if (buf_len < n) {
        n = buf_len;
      }
      if (n == uVar1) {
        bVar2 = compress_block(this,pBuf,uVar1);
      }
      else {
        bVar3 = vector<unsigned_char>::append(&this->m_block_buf,(uchar *)pBuf,n);
        if (!bVar3) {
          return false;
        }
        uVar1 = (this->m_block_buf).m_size;
        if (uVar1 == (this->m_params).m_block_size) {
          bVar2 = compress_block(this,(this->m_block_buf).m_p,uVar1);
          vector<unsigned_char>::try_resize(&this->m_block_buf,0,false);
        }
      }
      if (bVar2 == false) break;
      pBuf = (void *)((long)pBuf + (ulong)n);
      buf_len = buf_len - n;
    }
    return false;
  }
  uVar1 = (this->m_block_buf).m_size;
  if (uVar1 != 0) {
    bVar2 = compress_block(this,(this->m_block_buf).m_p,uVar1);
    bVar3 = false;
    vector<unsigned_char>::try_resize(&this->m_block_buf,0,false);
    if (!bVar2) goto LAB_0010984d;
  }
  bVar3 = send_final_block(this);
LAB_0010984d:
  this->m_finished = true;
  return bVar3;
}

Assistant:

bool lzcompressor::put_bytes(const void* pBuf, uint buf_len)
   {
      LZHAM_ASSERT(!m_finished);
      if (m_finished)
      {
         LZHAM_LOG_ERROR(7024);
         return false;
      }

      bool status = true;

      if (!pBuf)
      {
         // Last block - flush whatever's left and send the final block.
         if (m_block_buf.size())
         {
            status = compress_block(m_block_buf.get_ptr(), m_block_buf.size());

            m_block_buf.try_resize(0);
         }

         if (status)
         {
            if (!send_final_block())
            {
               status = false;
               LZHAM_LOG_ERROR(7025);
            }
         }

         m_finished = true;
      }
      else
      {
         // Compress blocks.
         const uint8 *pSrcBuf = static_cast<const uint8*>(pBuf);
         uint num_src_bytes_remaining = buf_len;

         while (num_src_bytes_remaining)
         {
            const uint num_bytes_to_copy = LZHAM_MIN(num_src_bytes_remaining, m_params.m_block_size - m_block_buf.size());

            if (num_bytes_to_copy == m_params.m_block_size)
            {
               LZHAM_ASSERT(!m_block_buf.size());

               // Full-block available - compress in-place.
               status = compress_block(pSrcBuf, num_bytes_to_copy);
            }
            else
            {
               // Less than a full block available - append to already accumulated bytes.
               if (!m_block_buf.append(static_cast<const uint8 *>(pSrcBuf), num_bytes_to_copy))
               {
                  LZHAM_LOG_ERROR(7026);
                  return false;
               }

               LZHAM_ASSERT(m_block_buf.size() <= m_params.m_block_size);

               if (m_block_buf.size() == m_params.m_block_size)
               {
                  status = compress_block(m_block_buf.get_ptr(), m_block_buf.size());

                  m_block_buf.try_resize(0);
               }
            }

            if (!status)
            {
               LZHAM_LOG_ERROR(7027);
               return false;
            }

            pSrcBuf += num_bytes_to_copy;
            num_src_bytes_remaining -= num_bytes_to_copy;
         }
      }

      lzham_flush_buffered_printf();

      return status;
   }